

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O0

uint __thiscall Histogram<unsigned_int>::bin(Histogram<unsigned_int> *this,uint value)

{
  uint uVar1;
  uint bin;
  uint value_local;
  Histogram<unsigned_int> *this_local;
  
  uVar1 = (**this->_vptr_Histogram)(this,(ulong)value);
  if (this->_lowerBound < uVar1) {
    if (uVar1 < this->_upperBound) {
      this_local._4_4_ =
           ((uVar1 - this->_lowerBound) * this->_bins) / (this->_upperBound - this->_lowerBound);
      if (this->_bins <= this_local._4_4_) {
        __assert_fail("bin < _bins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/histogram.h"
                      ,0x3e,"unsigned int Histogram<unsigned int>::bin(T) const [T = unsigned int]")
        ;
      }
    }
    else {
      this_local._4_4_ = this->_bins;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int bin(T value) const {
        value = v(value);
        if (value <= _lowerBound)
            return 0;
        if (value >= _upperBound)
            return _bins;

        unsigned int bin = (value - _lowerBound)*_bins/(_upperBound - _lowerBound);
        assert(bin < _bins);
        return bin;
    }